

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

void display_player_stat_info(void)

{
  short sVar1;
  char **ppcVar2;
  wchar_t row;
  long lVar3;
  char buf [80];
  
  c_put_str('\x01',"  Self",L'\x01',L'/');
  c_put_str('\x01'," RB",L'\x01',L'6');
  c_put_str('\x01'," CB",L'\x01',L':');
  c_put_str('\x01'," EB",L'\x01',L'>');
  c_put_str('\x01',"  Best",L'\x01',L'B');
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    ppcVar2 = stat_names;
    if (player->stat_cur[lVar3] < player->stat_max[lVar3]) {
      ppcVar2 = stat_names_reduced;
    }
    row = (int)lVar3 + L'\x02';
    put_str(ppcVar2[lVar3],row,L'*');
    sVar1 = player->stat_max[lVar3];
    if (sVar1 == 0x76) {
      put_str("!",row,L'-');
      sVar1 = player->stat_max[lVar3];
    }
    cnv_stat((int)sVar1,buf,0x50);
    c_put_str('\r',buf,row,L'/');
    strnfmt(buf,0x50,"%+3d",(ulong)(uint)player->race->r_adj[lVar3]);
    c_put_str('\x0e',buf,row,L'6');
    strnfmt(buf,0x50,"%+3d",(ulong)(uint)player->class->c_adj[lVar3]);
    c_put_str('\x0e',buf,row,L':');
    strnfmt(buf,0x50,"%+3d",(ulong)(uint)(player->state).stat_add[lVar3]);
    c_put_str('\x0e',buf,row,L'>');
    cnv_stat((player->state).stat_top[lVar3],buf,0x50);
    c_put_str('\r',buf,row,L'B');
    if (player->stat_cur[lVar3] < player->stat_max[lVar3]) {
      cnv_stat((player->state).stat_use[lVar3],buf,0x50);
      c_put_str('\v',buf,row,L'I');
    }
  }
  return;
}

Assistant:

void display_player_stat_info(void)
{
	int i, row, col;

	char buf[80];


	/* Row */
	row = 2;

	/* Column */
	col = 42;

	/* Print out the labels for the columns */
	c_put_str(COLOUR_WHITE, "  Self", row-1, col+5);
	c_put_str(COLOUR_WHITE, " RB", row-1, col+12);
	c_put_str(COLOUR_WHITE, " CB", row-1, col+16);
	c_put_str(COLOUR_WHITE, " EB", row-1, col+20);
	c_put_str(COLOUR_WHITE, "  Best", row-1, col+24);

	/* Display the stats */
	for (i = 0; i < STAT_MAX; i++) {
		/* Reduced or normal */
		if (player->stat_cur[i] < player->stat_max[i])
			/* Use lowercase stat name */
			put_str(stat_names_reduced[i], row+i, col);
		else
			/* Assume uppercase stat name */
			put_str(stat_names[i], row+i, col);

		/* Indicate natural maximum */
		if (player->stat_max[i] == 18+100)
			put_str("!", row+i, col+3);

		/* Internal "natural" maximum value */
		cnv_stat(player->stat_max[i], buf, sizeof(buf));
		c_put_str(COLOUR_L_GREEN, buf, row+i, col+5);

		/* Race Bonus */
		strnfmt(buf, sizeof(buf), "%+3d", player->race->r_adj[i]);
		c_put_str(COLOUR_L_BLUE, buf, row+i, col+12);

		/* Class Bonus */
		strnfmt(buf, sizeof(buf), "%+3d", player->class->c_adj[i]);
		c_put_str(COLOUR_L_BLUE, buf, row+i, col+16);

		/* Equipment Bonus */
		strnfmt(buf, sizeof(buf), "%+3d", player->state.stat_add[i]);
		c_put_str(COLOUR_L_BLUE, buf, row+i, col+20);

		/* Resulting "modified" maximum value */
		cnv_stat(player->state.stat_top[i], buf, sizeof(buf));
		c_put_str(COLOUR_L_GREEN, buf, row+i, col+24);

		/* Only display stat_use if there has been draining */
		if (player->stat_cur[i] < player->stat_max[i]) {
			cnv_stat(player->state.stat_use[i], buf, sizeof(buf));
			c_put_str(COLOUR_YELLOW, buf, row+i, col+31);
		}
	}
}